

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

int secp256k1_jacobi64_maybe_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  int iVar1;
  void *in_RSI;
  void *in_RDI;
  bool bVar2;
  secp256k1_modinv64_trans2x2 t;
  int count;
  int jac;
  int64_t gn;
  int64_t fn;
  int64_t cond;
  int64_t eta;
  int len;
  int j;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  int local_98;
  ulong local_80;
  int iVar3;
  int in_stack_ffffffffffffff94;
  secp256k1_modinv64_trans2x2 *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  secp256k1_modinv64_trans2x2 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint64_t in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffc0;
  ulong local_38 [7];
  
  memcpy(&stack0xffffffffffffffc0,in_RSI,0x28);
  memcpy(&stack0xffffffffffffff98,in_RDI,0x28);
  iVar3 = 5;
  bVar2 = false;
  if ((((-1 < (long)in_stack_ffffffffffffff98) && (bVar2 = false, -1 < in_stack_ffffffffffffffa4))
      && (bVar2 = false, -1 < (long)in_stack_ffffffffffffffa8)) &&
     (bVar2 = false, -1 < in_stack_ffffffffffffffb4)) {
    bVar2 = -1 < (long)in_stack_ffffffffffffffb8;
  }
  if (!bVar2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
            ,0x2dc,
            "test condition failed: g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0"
           );
    abort();
  }
  if ((((in_stack_ffffffffffffff98 == (secp256k1_modinv64_trans2x2 *)0x0 &&
        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0) == 0) &&
       in_stack_ffffffffffffffa8 == (secp256k1_modinv64_trans2x2 *)0x0) &&
      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0) == 0) &&
      in_stack_ffffffffffffffb8 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
            ,0x2e1,"test condition failed: (g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0");
    abort();
  }
  local_98 = 0;
  while( true ) {
    if (0xb < local_98) {
      return 0;
    }
    secp256k1_modinv64_posdivsteps_62_var
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,
               (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4,
                       (secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff98,
                       CONCAT44(in_stack_ffffffffffffff94,iVar3));
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
              ,0x2e8,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4,
                       (secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff98,
                       CONCAT44(in_stack_ffffffffffffff94,iVar3));
    if (0 < iVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
              ,0x2e9,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4,
                       (secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff98,
                       CONCAT44(in_stack_ffffffffffffff94,iVar3));
    if (iVar1 < 1) break;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4,
                       (secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff98,
                       CONCAT44(in_stack_ffffffffffffff94,iVar3));
    if (-1 < iVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
              ,0x2eb,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0"
             );
      abort();
    }
    secp256k1_modinv64_update_fg_62_var
              (in_stack_ffffffffffffffb4,(secp256k1_modinv64_signed62 *)in_stack_ffffffffffffffa8,
               (secp256k1_modinv64_signed62 *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    if (in_stack_ffffffffffffffc0 == 1) {
      local_80 = 0;
      for (in_stack_ffffffffffffff94 = 1; in_stack_ffffffffffffff94 < iVar3;
          in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
        local_80 = local_38[(long)in_stack_ffffffffffffff94 + -1] | local_80;
      }
      if (local_80 == 0) {
        return 1;
      }
    }
    if (*(long *)(&stack0xffffffffffffff98 + (long)(iVar3 + -1) * 8) == 0 &&
        (local_38[(long)(iVar3 + -1) + -1] == 0 && -1 < (long)iVar3 + -2)) {
      iVar3 = iVar3 + -1;
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4,
                       (secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff98,
                       CONCAT44(in_stack_ffffffffffffff94,iVar3));
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
              ,0x302,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4,
                       (secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff98,
                       CONCAT44(in_stack_ffffffffffffff94,iVar3));
    if (0 < iVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
              ,0x303,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4,
                       (secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff98,
                       CONCAT44(in_stack_ffffffffffffff94,iVar3));
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
              ,0x304,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4,
                       (secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff98,
                       CONCAT44(in_stack_ffffffffffffff94,iVar3));
    if (-1 < iVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
              ,0x305,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0"
             );
      abort();
    }
    local_98 = local_98 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
          ,0x2ea,
          "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0")
  ;
  abort();
}

Assistant:

static int secp256k1_jacobi64_maybe_var(const secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0);

    for (count = 0; count < JACOBI64_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 62 posdivsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_posdivsteps_62_var(eta, f.v[0] | ((uint64_t)f.v[1] << 62), g.v[0] | ((uint64_t)g.v[1] << 62), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. When f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1550 iterations. Return 0, indicating unknown result. */
    return 0;
}